

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

void __thiscall cmFindLibraryHelper::AddName(cmFindLibraryHelper *this,string *name)

{
  cmFindLibraryHelper *this_00;
  string regex;
  Name entry;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  pointer local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  RegularExpression local_f0;
  
  this_00 = (cmFindLibraryHelper *)local_138;
  local_118[0] = false;
  local_108 = (pointer)0x0;
  local_100._M_local_buf[0] = '\0';
  local_f0.regmatch.startp[0] = (char *)0x0;
  local_f0.regmatch.endp[0] = (char *)0x0;
  local_f0.regmatch.searchstring = (char *)0x0;
  local_f0.program = (char *)0x0;
  local_110._M_p = (pointer)&local_100;
  local_118[0] = HasValidSuffix(this,name);
  std::__cxx11::string::_M_assign((string *)&local_110);
  local_138._0_8_ = (cmMakefile *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"^","");
  std::__cxx11::string::_M_append(local_138,(ulong)(this->PrefixRegexStr)._M_dataplus._M_p);
  RegexFromLiteral(this_00,(string *)local_138,name);
  std::__cxx11::string::_M_append(local_138,(ulong)(this->SuffixRegexStr)._M_dataplus._M_p);
  if (this->OpenBSD == true) {
    std::__cxx11::string::append(local_138);
  }
  std::__cxx11::string::append(local_138);
  cmsys::RegularExpression::compile(&local_f0,(char *)local_138._0_8_);
  std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::
  emplace_back<cmFindLibraryHelper::Name>(&this->Names,(Name *)local_118);
  if ((cmMakefile *)local_138._0_8_ != (cmMakefile *)local_128) {
    operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
  }
  if ((pointer)local_f0.program != (pointer)0x0) {
    operator_delete__(local_f0.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_p != &local_100) {
    operator_delete(local_110._M_p,
                    CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmFindLibraryHelper::AddName(std::string const& name)
{
  Name entry;

  // Consider checking the raw name too.
  entry.TryRaw = this->HasValidSuffix(name);
  entry.Raw = name;

  // Build a regular expression to match library names.
  std::string regex = "^";
  regex += this->PrefixRegexStr;
  this->RegexFromLiteral(regex, name);
  regex += this->SuffixRegexStr;
  if (this->OpenBSD) {
    regex += "(\\.[0-9]+\\.[0-9]+)?";
  }
  regex += "$";
  entry.Regex.compile(regex.c_str());
  this->Names.push_back(std::move(entry));
}